

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

QRect __thiscall QTreeWidget::visualItemRect(QTreeWidget *this,QTreeWidgetItem *item)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  QHeaderView *pQVar4;
  QHeaderView *pQVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  QRect local_b8;
  QRect local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTreeWidgetPrivate::index
            ((QTreeWidgetPrivate *)&local_58,
             *(char **)&(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.
                        super_QFrame.super_QWidget.field_0x8,(int)item);
  pQVar4 = QTreeView::header(&this->super_QTreeView);
  pQVar5 = QTreeView::header(&this->super_QTreeView);
  iVar1 = QHeaderView::offset(pQVar5);
  iVar1 = QHeaderView::logicalIndexAt(pQVar4,-iVar1);
  pQVar4 = QTreeView::header(&this->super_QTreeView);
  pQVar5 = QTreeView::header(&this->super_QTreeView);
  iVar2 = QHeaderView::length(pQVar5);
  pQVar5 = QTreeView::header(&this->super_QTreeView);
  uVar3 = QHeaderView::offset(pQVar5);
  iVar2 = QHeaderView::logicalIndexAt(pQVar4,iVar2 + ~uVar3);
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::sibling((QModelIndex *)&local_78,(QModelIndex *)&local_58,(int)local_58,iVar1);
  local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::sibling((QModelIndex *)&local_98,(QModelIndex *)&local_58,(int)local_58,iVar2);
  local_a8 = (QRect)(**(code **)(*(long *)&(this->super_QTreeView).super_QAbstractItemView.
                                           super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                0x1e0))(this,(QModelIndex *)&local_78);
  local_b8 = (QRect)(**(code **)(*(long *)&(this->super_QTreeView).super_QAbstractItemView.
                                           super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                0x1e0))(this,(QModelIndex *)&local_98);
  QVar6 = (QRect)QRect::operator|(&local_a8,&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTreeWidget::visualItemRect(const QTreeWidgetItem *item) const
{
    Q_D(const QTreeWidget);
    //the visual rect for an item is across all columns. So we need to determine
    //what is the first and last column and get their visual index rects
    const QModelIndex base = d->index(item);
    const int firstVisiblesection = header()->logicalIndexAt(- header()->offset());
    const int lastVisibleSection = header()->logicalIndexAt(header()->length() - header()->offset() - 1);
    const QModelIndex first = base.sibling(base.row(), firstVisiblesection);
    const QModelIndex last = base.sibling(base.row(), lastVisibleSection);
    return visualRect(first) | visualRect(last);
}